

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::ConsoleReporter::ConsoleReporter(ConsoleReporter *this,ReporterConfig *config)

{
  ReporterConfig RVar1;
  ostream *poVar2;
  vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *pvVar3;
  int iVar4;
  TablePrinter *pTVar5;
  long lVar6;
  allocator_type *paVar7;
  undefined1 auVar8 [16];
  initializer_list<Catch::(anonymous_namespace)::ColumnInfo> __l;
  initializer_list<Catch::(anonymous_namespace)::ColumnInfo> __l_00;
  size_type __dnew;
  allocator_type *local_f0;
  undefined1 local_e8 [16];
  pointer local_d8;
  ColumnInfo local_d0;
  allocator_type **local_a8;
  allocator_type *local_a0;
  allocator_type *local_98;
  undefined4 local_90;
  undefined1 local_8c;
  undefined8 local_88;
  allocator_type **local_80;
  allocator_type *local_78;
  allocator_type *local_70;
  undefined4 local_68;
  undefined1 local_64;
  undefined8 local_60;
  allocator_type *local_58;
  allocator_type *local_50;
  allocator_type *local_48;
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  (this->super_StreamingReporterBase).super_IStreamingReporter.m_preferences.shouldRedirectStdOut =
       false;
  (this->super_StreamingReporterBase).super_IStreamingReporter.m_preferences.
  shouldReportAllAssertions = false;
  RVar1 = *config;
  auVar8._0_8_ = RVar1.m_fullConfig;
  auVar8._8_4_ = (int)RVar1.m_stream;
  auVar8._12_4_ = RVar1.m_stream._4_4_;
  (this->super_StreamingReporterBase).m_config = auVar8._0_8_;
  (this->super_StreamingReporterBase).stream = (ostream *)auVar8._8_8_;
  (this->super_StreamingReporterBase).currentTestRunInfo.super_Option<Catch::TestRunInfo>.
  nullableValue = (TestRunInfo *)0x0;
  (this->super_StreamingReporterBase).currentTestRunInfo.used = false;
  (this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.nullableValue
       = (GroupInfo *)0x0;
  (this->super_StreamingReporterBase).currentGroupInfo.used = false;
  (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
  (this->super_StreamingReporterBase).m_sectionStack.
  super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pvVar3 = &(this->super_StreamingReporterBase).m_sectionStack;
  (pvVar3->super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar3->super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_StreamingReporterBase).super_IStreamingReporter._vptr_IStreamingReporter =
       (_func_int **)&PTR__ConsoleReporter_001f9800;
  pTVar5 = (TablePrinter *)operator_new(0x38);
  poVar2 = config->m_stream;
  iVar4 = (*config->m_fullConfig->_vptr_IConfig[0x15])();
  if ((char)iVar4 == '\0') {
    local_d0.name._M_dataplus._M_p = (pointer)&local_d0.name.field_2;
    local_d0.name.field_2._M_allocated_capacity._0_6_ = 0x6d68636e6562;
    local_d0.name.field_2._M_allocated_capacity._6_2_ = 0x7261;
    local_d0.name.field_2._8_6_ = 0x656d616e206b;
    local_d0.name._M_string_length = 0xe;
    local_d0.name.field_2._M_local_buf[0xe] = '\0';
    local_d0.width = 0x25;
    local_d0.justification = Left;
    local_a8 = &local_98;
    local_f0 = (allocator_type *)0x1f;
    local_a8 = (allocator_type **)
               std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_f0);
    local_98 = local_f0;
    builtin_strncpy((char *)((long)local_a8 + 0xf),"an      ",8);
    builtin_strncpy((char *)((long)local_a8 + 0x17)," std dev",8);
    *local_a8 = (allocator_type *)0x2073656c706d6173;
    local_a8[1] = (allocator_type *)0x61656d2020202020;
    local_a0 = local_f0;
    *(allocator_type *)((long)local_a8 + (long)local_f0) = (allocator_type)0x0;
    local_88 = 0x10000000e;
    local_80 = &local_70;
    local_f0 = (allocator_type *)0x23;
    local_80 = (allocator_type **)
               std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_f0);
    local_70 = local_f0;
    local_80[2] = (allocator_type *)0x2020206e61656d20;
    local_80[3] = (allocator_type *)0x2064747320776f6c;
    *local_80 = (allocator_type *)0x6f69746172657469;
    local_80[1] = (allocator_type *)0x776f6c202020736e;
    builtin_strncpy((char *)((long)local_80 + 0x1f)," dev",4);
    local_78 = local_f0;
    *(allocator_type *)((long)local_80 + (long)local_f0) = (allocator_type)0x0;
    local_60 = 0x10000000e;
    paVar7 = (allocator_type *)&local_48;
    local_f0 = (allocator_type *)0x24;
    local_58 = paVar7;
    auVar8 = std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_f0);
    __l_00._M_len = auVar8._8_8_;
    local_58 = auVar8._0_8_;
    local_48 = local_f0;
    *(undefined8 *)(local_58 + 0x10) = 0x20206e61656d2068;
    *(undefined8 *)(local_58 + 0x18) = 0x6474732068676968;
    *(undefined8 *)local_58 = 0x6574616d69747365;
    *(undefined8 *)(local_58 + 8) = 0x6769682020202064;
    *(undefined4 *)(local_58 + 0x20) = 0x76656420;
    local_50 = local_f0;
    local_58[(long)local_f0] = (allocator_type)0x0;
    local_38 = 0x10000000e;
    __l_00._M_array = &local_d0;
    std::
    vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
    ::vector((vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
              *)local_e8,__l_00,local_f0);
    lVar6 = -0xa0;
    do {
      if (paVar7 != *(allocator_type **)(paVar7 + -0x10)) {
        operator_delete(*(allocator_type **)(paVar7 + -0x10),(ulong)(*(allocator_type **)paVar7 + 1)
                       );
      }
      paVar7 = paVar7 + -0x28;
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0);
  }
  else {
    local_d0.name._M_dataplus._M_p = (pointer)&local_d0.name.field_2;
    local_d0.name.field_2._M_allocated_capacity._0_6_ = 0x6d68636e6562;
    local_d0.name.field_2._M_allocated_capacity._6_2_ = 0x7261;
    local_d0.name.field_2._8_6_ = 0x656d616e206b;
    local_d0.name._M_string_length = 0xe;
    local_d0.name.field_2._M_local_buf[0xe] = '\0';
    local_d0.width = 0x25;
    local_d0.justification = Left;
    local_a8 = &local_98;
    local_98 = (allocator_type *)0x6d61732020202020;
    local_90 = 0x73656c70;
    local_a0 = (allocator_type *)0xc;
    local_8c = 0;
    local_88 = 0x10000000e;
    local_80 = &local_70;
    local_70 = (allocator_type *)0x7461726574692020;
    local_68 = 0x736e6f69;
    local_78 = (allocator_type *)0xc;
    local_64 = 0;
    local_60 = 0x10000000e;
    paVar7 = (allocator_type *)&local_48;
    local_48 = (allocator_type *)0x2020202020202020;
    local_40 = 0x6e61656d;
    local_50 = (allocator_type *)0xc;
    local_3c = 0;
    local_38 = 0x10000000e;
    __l._M_len = 0xc;
    __l._M_array = &local_d0;
    local_58 = paVar7;
    std::
    vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
    ::vector((vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
              *)local_e8,__l,(allocator_type *)0x0);
    lVar6 = -0xa0;
    do {
      if (paVar7 != *(allocator_type **)(paVar7 + -0x10)) {
        operator_delete(*(allocator_type **)(paVar7 + -0x10),(ulong)(*(allocator_type **)paVar7 + 1)
                       );
      }
      paVar7 = paVar7 + -0x28;
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0);
  }
  pTVar5->m_os = poVar2;
  (pTVar5->m_columnInfos).
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_e8._0_8_;
  (pTVar5->m_columnInfos).
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_e8._8_8_;
  (pTVar5->m_columnInfos).
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_d8;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = (pointer)0x0;
  ReusableStringStream::ReusableStringStream(&pTVar5->m_oss);
  pTVar5->m_currentColumn = -1;
  pTVar5->m_isOpen = false;
  (this->m_tablePrinter).m_ptr = pTVar5;
  std::
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ::~vector((vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             *)local_e8);
  this->m_headerPrinted = false;
  return;
}

Assistant:

ConsoleReporter::ConsoleReporter(ReporterConfig const &config)
        : StreamingReporterBase(config),
        m_tablePrinter(new TablePrinter(config.stream(),
            [&config]() -> std::vector<ColumnInfo> {
                if (config.fullConfig()->benchmarkNoAnalysis())
                {
                    return{
                        { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, Justification::Left },
                        { "     samples", 14, Justification::Right },
                        { "  iterations", 14, Justification::Right },
                        { "        mean", 14, Justification::Right }
                    };
                }
                else
                {
                    return{
                        { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, Justification::Left },
                        { "samples      mean       std dev", 14, Justification::Right },
                        { "iterations   low mean   low std dev", 14, Justification::Right },
                        { "estimated    high mean  high std dev", 14, Justification::Right }
                    };
                }
            }())) {}